

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

uintptr_t NodeParamMeta(nodeclass *Class,uint_fast32_t Meta,dataid Id,node *Node)

{
  nodemeta *pnVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  char *unaff_R13;
  uintptr_t *puVar7;
  nodeclass *pnVar8;
  uintptr_t Data;
  char *local_48;
  node *local_40;
  ulong local_38;
  
  local_40 = Node;
  local_38 = Meta;
  if (Class != (nodeclass *)0x0) {
    do {
      pnVar1 = Class->Meta;
      if (pnVar1 != (nodemeta *)0x0) {
        uVar6 = *(uint *)pnVar1;
        uVar3 = uVar6 & 0xff;
        if (uVar3 != 0) {
          puVar7 = &pnVar1->Data;
          do {
            if (uVar6 >> 8 == Id) {
              if (uVar3 == Meta) {
                return *puVar7;
              }
              if ((uVar3 == 0x32) &&
                 (lVar4 = (*(code *)*puVar7)(local_40,Id,Meta,&local_48), lVar4 != 0)) {
                return (uintptr_t)local_48;
              }
            }
            uVar6 = (uint)puVar7[1];
            puVar7 = puVar7 + 2;
            uVar3 = uVar6 & 0xff;
          } while (uVar3 != 0);
        }
      }
      if (Meta == 0x2c) {
        lVar4 = *(long *)(Class + 1);
        for (pnVar8 = Class->ParentClass; pnVar8 != (nodeclass *)0x0; pnVar8 = pnVar8->ParentClass)
        {
          pnVar1 = pnVar8->Meta;
          if (pnVar1 != (nodemeta *)0x0) {
            uVar6 = *(uint *)pnVar1;
            while ((uVar6 & 0xff) != 0) {
              if ((((uVar6 & 0xff) == 0x32) && (uVar6 >> 8 == Id)) &&
                 (lVar5 = (*(code *)pnVar1->Data)(local_40,Id,0x2c,&local_48), lVar5 != 0)) {
                bVar2 = false;
                unaff_R13 = local_48;
                Class = pnVar8;
                goto LAB_0010d092;
              }
              uVar6 = *(uint *)(pnVar1 + 1);
              pnVar1 = pnVar1 + 1;
            }
          }
        }
        if (*(long *)(lVar4 + 0xa0) == 0) {
          bVar2 = true;
        }
        else {
          do {
            local_48 = (char *)(**(code **)(lVar4 + 0xa0))
                                         (lVar4,*(undefined4 *)&Class[1].Meta,Id & 0xffffffff);
            if ((local_48 != (char *)0x0) && (*local_48 != '\0')) {
              bVar2 = false;
              unaff_R13 = local_48;
              goto LAB_0010d092;
            }
            Class = Class->ParentClass;
          } while (Class != (nodeclass *)0x0);
          bVar2 = false;
          Class = (nodeclass *)0x0;
          unaff_R13 = "";
        }
LAB_0010d092:
        Meta = local_38;
        if (!bVar2) {
          return (uintptr_t)unaff_R13;
        }
      }
      Class = Class->ParentClass;
    } while (Class != (nodeclass *)0x0);
  }
  return 0;
}

Assistant:

static uintptr_t NOINLINE NodeParamMeta(const nodeclass* Class, uint_fast32_t Meta, dataid Id, const node* Node)
{
    uintptr_t Data;
    const nodemeta* m;

    for (;Class;Class=Class->ParentClass)
    {
        if (Class->Meta) // should be registered, just fail safe
            for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                if (m->Id == Id)
                {
                    if (m->Meta == Meta)
                        return m->Data;
                    if (m->Meta == META_PARAM_META && ((bool_t(*)(const node*,dataid,datameta,uintptr_t*))m->Data)(Node,Id,Meta,&Data))
                        return Data;
                }

        if (Meta == META_PARAM_STRING)
        {
            const nodeclass* MainClass = Class;
            nodecontext* Context = NodeClass_Context(Class);

            // only check for META_PARAM_META...
            while ((Class=Class->ParentClass)!=NULL)
            {
                if (Class->Meta) // should be registered, just fail safe
                    for (m=Class->Meta;m->Meta != META_CLASS_PARENT_ID;++m)
                        if (m->Id == Id && m->Meta == META_PARAM_META && ((bool_t(*)(const node*,dataid,datameta,uintptr_t*))m->Data)(Node,Id,Meta,&Data))
                            return Data;
            }

            Class = MainClass;
            if (Context->ExternalStr)
            {
                do {
                    Data = (uintptr_t)Context->ExternalStr(Context,NodeClass_ClassId(Class),(int)Id);
                    if (Data!=0 && *((const tchar_t*)Data))
                        return Data;
                } while ((Class=Class->ParentClass)!=NULL);
                return (uintptr_t)T("");
            }
        }
    }
    return 0;
}